

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedForward.h
# Opt level: O2

void kwsys_shared_forward_print_failure(char **argv)

{
  char msg [4096];
  
  kwsys_shared_forward_strerror(msg);
  fwrite("Error running",0xd,1,_stderr);
  while( true ) {
    if (*argv == (char *)0x0) break;
    fprintf(_stderr," \"%s\"");
    argv = argv + 1;
  }
  fprintf(_stderr,": %s\n",msg);
  return;
}

Assistant:

static void kwsys_shared_forward_print_failure(char const* const* argv)
{
  char msg[KWSYS_SHARED_FORWARD_MAXPATH];
  char const* const* arg = argv;
  kwsys_shared_forward_strerror(msg);
  fprintf(stderr, "Error running");
  for(; *arg; ++arg)
    {
    fprintf(stderr, " \"%s\"", *arg);
    }
  fprintf(stderr, ": %s\n", msg);
}